

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::r_formatter<spdlog::details::scoped_padder>::format
          (r_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  int iVar1;
  memory_buf_t *dest_00;
  int n;
  char *this_00;
  string_view_t view;
  char local_39;
  scoped_padder p;
  
  dest_00 = dest;
  scoped_padder::scoped_padder(&p,0xb,&(this->super_flag_formatter).padinfo_,dest);
  iVar1 = tm_time->tm_hour;
  n = iVar1 + -0xc;
  if (iVar1 < 0xd) {
    n = iVar1;
  }
  fmt_helper::pad2(n,dest);
  local_39 = ':';
  fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
  fmt_helper::pad2(tm_time->tm_min,dest);
  local_39 = ':';
  fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
  fmt_helper::pad2(tm_time->tm_sec,dest);
  local_39 = ' ';
  fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
  this_00 = "AM";
  if (0xb < tm_time->tm_hour) {
    this_00 = "PM";
  }
  view.size_ = (size_t)dest;
  view.data_ = (char *)0x2;
  fmt_helper::append_string_view((fmt_helper *)this_00,view,dest_00);
  scoped_padder::~scoped_padder(&p);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 11;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(to12h(tm_time), dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }